

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O0

bool __thiscall TinyProcessLib::Process::try_get_exit_status(Process *this,int *exit_status)

{
  int *piVar1;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  id_type p;
  int *exit_status_local;
  Process *this_local;
  
  if ((this->data).id < 1) {
    this_local._7_1_ = false;
  }
  else {
    lock._M_device._4_4_ = waitpid((this->data).id,exit_status,1);
    if ((lock._M_device._4_4_ < 0) && (piVar1 = __errno_location(), *piVar1 == 10)) {
      *exit_status = (this->data).exit_status;
      return true;
    }
    if (lock._M_device._4_4_ < 1) {
      this_local._7_1_ = false;
    }
    else {
      if (0xff < *exit_status) {
        *exit_status = *exit_status >> 8;
      }
      (this->data).exit_status = *exit_status;
      std::lock_guard<std::mutex>::lock_guard(&local_30,&this->close_mutex);
      this->closed = true;
      std::lock_guard<std::mutex>::~lock_guard(&local_30);
      close_fds(this);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Process::try_get_exit_status(int &exit_status) noexcept {
  if(data.id <= 0)
    return false;

  const id_type p = waitpid(data.id, &exit_status, WNOHANG);
  if(p < 0 && errno == ECHILD) {
    // PID doesn't exist anymore, set previously sampled exit status (or -1)
    exit_status = data.exit_status;
    return true;
  }
  else if(p <= 0) {
    // Process still running (p==0) or error
    return false;
  }
  else {
    // store exit status for future calls
    if(exit_status >= 256)
      exit_status = exit_status >> 8;
    data.exit_status = exit_status;
  }

  {
    std::lock_guard<std::mutex> lock(close_mutex);
    closed = true;
  }
  close_fds();

  return true;
}